

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::RenderingCompleteCellsRunProducesCells(RendererTests *this)

{
  bypass_alpha *this_00;
  int area_00;
  uint uVar1;
  int length;
  cell *pcVar2;
  bool bVar3;
  allocator local_131;
  string local_130 [32];
  LocationInfo local_110;
  undefined1 auStack_e8 [8];
  span reference [3];
  undefined1 auStack_a8 [8];
  cell cells [3];
  undefined1 local_78 [8];
  scanline_mockup sl;
  RendererTests *this_local;
  int len;
  int cover_m;
  int area;
  int x;
  cell *i;
  int cover;
  
  sl._32_8_ = this;
  anon_unknown_1::scanline_mockup::scanline_mockup((scanline_mockup *)local_78,true);
  cells[2].x = 0;
  auStack_a8._0_4_ = 7;
  auStack_a8._4_4_ = 0x10200;
  cells[0].x = 0;
  cells[0].area = 0x11;
  cells[0].cover = 0x8e00;
  cells[1].x = 0;
  cells[1].area = 0x12;
  cells[1].cover = 0x2600;
  _area = begin<agge::tests::mocks::cell,3ul>((cell (*) [3])auStack_a8);
  pcVar2 = end<agge::tests::mocks::cell,3ul>((cell (*) [3])auStack_a8);
  this_00 = (bypass_alpha *)((long)&reference[2].length + 3);
  i._4_4_ = 0;
  if (_area != pcVar2) {
    while( true ) {
      cover_m = _area->x;
      len = 0;
      do {
        len = _area->area + len;
        i._4_4_ = _area->cover + i._4_4_;
        _area = _area + 1;
        bVar3 = false;
        if (_area != pcVar2) {
          bVar3 = _area->x == cover_m;
        }
      } while (bVar3);
      area_00 = i._4_4_ * 0x200;
      if (len != 0) {
        uVar1 = anon_unknown_1::bypass_alpha::operator()(this_00,area_00 - len);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)local_78,cover_m,uVar1);
        cover_m = cover_m + 1;
      }
      if (_area == pcVar2) break;
      length = _area->x - cover_m;
      if ((length != 0) && (area_00 != 0)) {
        uVar1 = anon_unknown_1::bypass_alpha::operator()(this_00,area_00);
        anon_unknown_1::scanline_mockup::add_span((scanline_mockup *)local_78,cover_m,length,uVar1);
      }
    }
  }
  reference[1].length = 0x7fffffff;
  reference[1].cover = 0x12;
  reference[2].y = 0;
  reference[2].x = -0x2600;
  reference[0].length = 0x7fffffff;
  reference[0].cover = 0x11;
  reference[1].y = 0;
  reference[1].x = -0x8e00;
  auStack_e8._0_4_ = 0x7fffffff;
  auStack_e8._4_4_ = 7;
  reference[0].y = 0;
  reference[0].x = -0x10200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_131);
  ut::LocationInfo::LocationInfo(&local_110,(string *)local_130,0x81);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [3])auStack_e8,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl,&local_110);
  ut::LocationInfo::~LocationInfo(&local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  anon_unknown_1::scanline_mockup::~scanline_mockup((scanline_mockup *)local_78);
  return;
}

Assistant:

test( RenderingCompleteCellsRunProducesCells )
			{
				// INIT
				scanline_mockup sl;
				mocks::cell cells[] = { { 7, 129 * 512, 0 }, { 17, 71 * 512, 0 }, { 18, 19 * 512, 0 }, };

				// ACT
				sweep_scanline<8>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference[] = {
					{ 0x7fffffff, 7, 0, -129 * 512 },
					{ 0x7fffffff, 17, 0, -71 * 512 },
					{ 0x7fffffff, 18, 0, -19 * 512 },
				};

				assert_equal(reference, sl.spans_log);
			}